

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O1

void setTTYCursor(bool enable)

{
  int __fd;
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  char *pcVar4;
  char **ppcVar5;
  long in_FS_OFFSET;
  char *devs [4];
  char *local_48;
  char *local_40 [3];
  long local_28;
  
  ppcVar5 = &local_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (setTTYCursor(bool)::ignore == '\0') {
    setTTYCursor();
  }
  if (setTTYCursor::ignore == false) {
    pcVar4 = "/dev/tty0";
    local_48 = "/dev/tty0";
    local_40[0] = "/dev/tty";
    local_40[1] = "/dev/console";
    local_40[2] = (char *)0x0;
    do {
      do {
        __fd = open64(pcVar4,0x80002,0x1ff);
        if (__fd != -1) {
          pcVar4 = "\x1b[9;0]\x1b[?33l\x1b[?25l\x1b[?1c";
          if (enable) {
            pcVar4 = "\x1b[9;15]\x1b[?33h\x1b[?25h\x1b[?0c";
          }
          goto LAB_0011dbf2;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      pcVar4 = *(char **)((long)ppcVar5 + 8);
      ppcVar5 = (char **)((long)ppcVar5 + 8);
    } while (pcVar4 != (char *)0x0);
  }
  goto LAB_0011dc27;
  while (piVar2 = __errno_location(), *piVar2 == 4) {
LAB_0011dbf2:
    sVar3 = write(__fd,pcVar4,(ulong)enable | 0x18);
    if (sVar3 != -1) break;
  }
  do {
    iVar1 = close(__fd);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
LAB_0011dc27:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void setTTYCursor(bool enable)
{
    static bool ignore = qEnvironmentVariableIntValue("QT_QPA_PRESERVE_CONSOLE_STATE");
    if (ignore)
        return;

    const char * const devs[] = { "/dev/tty0", "/dev/tty", "/dev/console", 0 };
    int fd = -1;
    for (const char * const *dev = devs; *dev; ++dev) {
        fd = QT_OPEN(*dev, O_RDWR);
        if (fd != -1) {
            // Enable/disable screen blanking and the blinking cursor.
            const char *termctl = enable ? "\033[9;15]\033[?33h\033[?25h\033[?0c" : "\033[9;0]\033[?33l\033[?25l\033[?1c";
            QT_WRITE(fd, termctl, strlen(termctl) + 1);
            QT_CLOSE(fd);
            return;
        }
    }
}